

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::
UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>::
reset(UniqueBase<vk::DescriptorSetLayoutBuilder,_de::DefaultDeleter<vk::DescriptorSetLayoutBuilder>_>
      *this)

{
  DescriptorSetLayoutBuilder *ptr;
  
  ptr = (this->m_data).ptr;
  if (ptr != (DescriptorSetLayoutBuilder *)0x0) {
    DefaultDeleter<vk::DescriptorSetLayoutBuilder>::operator()
              ((DefaultDeleter<vk::DescriptorSetLayoutBuilder> *)&(this->m_data).field_0x8,ptr);
    (this->m_data).ptr = (DescriptorSetLayoutBuilder *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}